

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O1

int keymatch(char *arg,char *keyword,int minchars)

{
  char cVar1;
  char cVar2;
  char cVar3;
  ushort **ppuVar4;
  int __c;
  long lVar5;
  
  cVar1 = *arg;
  if (cVar1 != '\0') {
    lVar5 = 0;
    cVar3 = cVar1;
    do {
      cVar2 = keyword[lVar5];
      if (cVar2 == '\0') {
        return 0;
      }
      __c = (int)cVar3;
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (long)__c * 2 + 1) & 1) != 0) {
        __c = tolower(__c);
      }
      if (__c != cVar2) {
        return 0;
      }
      cVar3 = arg[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (cVar3 != '\0');
  }
  return (uint)(cVar1 != '\0');
}

Assistant:

static int
keymatch(char *arg, const char *keyword, int minchars)
/* Case-insensitive matching of (possibly abbreviated) keyword switches. */
/* keyword is the constant keyword (must be lower case already), */
/* minchars is length of minimum legal abbreviation. */
{
  register int ca, ck;
  register int nmatched = 0;

  while ((ca = *arg++) != '\0') {
    if ((ck = *keyword++) == '\0')
      return 0;                 /* arg longer than keyword, no good */
    if (isupper(ca))            /* force arg to lcase (assume ck is already) */
      ca = tolower(ca);
    if (ca != ck)
      return 0;                 /* no good */
    nmatched++;                 /* count matched characters */
  }
  /* reached end of argument; fail if it's too short for unique abbrev */
  if (nmatched < minchars)
    return 0;
  return 1;                     /* A-OK */
}